

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * trimStr(string *__return_storage_ptr__,string *value)

{
  long lVar1;
  bool bVar2;
  char *local_38;
  char *chEnd;
  char *chBeg;
  char *bufEnd;
  char *bufStart;
  string *value_local;
  
  chEnd = (char *)std::__cxx11::string::c_str();
  lVar1 = std::__cxx11::string::length();
  local_38 = chEnd + lVar1 + -1;
  while( true ) {
    bVar2 = false;
    if (((chEnd < local_38) && (bVar2 = true, *chEnd != '\n')) && (bVar2 = true, *chEnd != '\r')) {
      bVar2 = *chEnd == ' ';
    }
    if (!bVar2) break;
    chEnd = chEnd + 1;
  }
  while( true ) {
    bVar2 = false;
    if (((chEnd <= local_38) && (bVar2 = true, *local_38 != '\n')) &&
       (bVar2 = true, *local_38 != '\r')) {
      bVar2 = *local_38 == ' ';
    }
    if (!bVar2) break;
    local_38 = local_38 + -1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)value);
  return __return_storage_ptr__;
}

Assistant:

string trimStr(const string& value)
{
    const char* bufStart = value.c_str();
    const char* bufEnd = bufStart + value.length() - 1;
    const char* chBeg = bufStart;
    const char* chEnd = bufEnd;
    for (; chBeg < bufEnd && (*chBeg == '\n' || *chBeg == '\r' || *chBeg == ' '); chBeg++)
        ;
    for (; chEnd >= chBeg && (*chEnd == '\n' || *chEnd == '\r' || *chEnd == ' '); chEnd--)
        ;
    return value.substr(chBeg - bufStart, chEnd - chBeg + 1);
}